

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

EmbeddingLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_embedding(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x96) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x96;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x38);
    EmbeddingLayerParams::EmbeddingLayerParams(this_00.embedding_);
    (this->layer_).embedding_ = (EmbeddingLayerParams *)this_00;
  }
  return (EmbeddingLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::EmbeddingLayerParams* NeuralNetworkLayer::mutable_embedding() {
  if (!has_embedding()) {
    clear_layer();
    set_has_embedding();
    layer_.embedding_ = new ::CoreML::Specification::EmbeddingLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.embedding)
  return layer_.embedding_;
}